

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  byte bVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined4 in_ECX;
  long *in_RDX;
  GenericInputFile *in_RDI;
  int in_stack_0000003c;
  Data *in_stack_00000040;
  Header *in_stack_000005f8;
  DeepScanLineInputFile *in_stack_00000600;
  InputStreamMutex *in_stack_ffffffffffffffa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets;
  LineOrder lineOrder;
  IStream *in_stack_ffffffffffffffd0;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepScanLineInputFile_004c03c0;
  lineOffsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1);
  pp_Var2 = (_func_int **)operator_new(0x208);
  Data::Data(in_stack_00000040,in_stack_0000003c);
  (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pp_Var2;
  p_Var3 = (_func_int *)operator_new(0x38);
  lineOrder = (LineOrder)((ulong)pp_Var2 >> 0x20);
  *(undefined8 *)(p_Var3 + 0x20) = 0;
  *(undefined8 *)(p_Var3 + 0x28) = 0;
  *(undefined8 *)(p_Var3 + 0x10) = 0;
  *(undefined8 *)(p_Var3 + 0x18) = 0;
  *(undefined8 *)p_Var3 = 0;
  *(undefined8 *)(p_Var3 + 8) = 0;
  *(undefined8 *)(p_Var3 + 0x30) = 0;
  InputStreamMutex::InputStreamMutex(in_stack_ffffffffffffffa0);
  in_RDI[1]._vptr_GenericInputFile[0x3f] = p_Var3;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x40) = 0;
  *(long **)(in_RDI[1]._vptr_GenericInputFile[0x3f] + 0x28) = in_RDX;
  bVar1 = (**(code **)(*in_RDX + 0x10))();
  *(byte *)(in_RDI[1]._vptr_GenericInputFile + 0x30) = bVar1 & 1;
  *(undefined4 *)(in_RDI[1]._vptr_GenericInputFile + 0xc) = in_ECX;
  initialize(in_stack_00000600,in_stack_000005f8);
  anon_unknown_0::readLineOffsets(in_stack_ffffffffffffffd0,lineOrder,lineOffsets,(bool *)in_RDI);
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    const Header&                            header,
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream* is,
    int                                      version,
    int                                      numThreads)
    : _data (new Data (numThreads))
{
    _data->_streamData     = new InputStreamMutex ();
    _data->_deleteStream   = false;
    _data->_streamData->is = is;

    _data->memoryMapped = is->isMemoryMapped ();

    _data->version = version;

    try
    {
        initialize (header);
    }
    catch (...)
    {
        if (_data && _data->_streamData) { delete _data->_streamData; }
        if (_data) delete _data;

        throw;
    }

    readLineOffsets (
        *_data->_streamData->is,
        _data->lineOrder,
        _data->lineOffsets,
        _data->fileIsComplete);
}